

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnixSharedLibrary.h
# Opt level: O2

void * __thiscall beagle::plugin::UnixSharedLibrary::findSymbol(UnixSharedLibrary *this,char *name)

{
  void *pvVar1;
  SharedLibraryException *this_00;
  
  pvVar1 = (void *)dlsym(this->m_handle);
  if (pvVar1 != (void *)0x0) {
    return pvVar1;
  }
  this_00 = (SharedLibraryException *)__cxa_allocate_exception(0x20);
  SharedLibraryException::SharedLibraryException(this_00,"Symbol Not Found");
  __cxa_throw(this_00,&SharedLibraryException::typeinfo,
              SharedLibraryException::~SharedLibraryException);
}

Assistant:

void* UnixSharedLibrary::findSymbol(const char* name)
{
    void* sym = dlsym(m_handle,name);
    if (sym == 0)
    throw SharedLibraryException("Symbol Not Found");
    else
    return sym;
}